

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_PrintMapKeysTest_Test::TestBody
          (MessageDifferencerTest_PrintMapKeysTest_Test *this)

{
  bool bVar1;
  void *pvVar2;
  Map<std::__cxx11::string,int> *pMVar3;
  long lVar4;
  char *pcVar5;
  char *in_R9;
  long *plVar6;
  pointer *__ptr;
  Any any1;
  string diff_with_any;
  Any any2;
  string diff;
  MessageDifferencer differencer;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_420;
  Message local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_410;
  undefined1 local_408 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  AssertHelper local_3e8;
  undefined1 local_3e0 [8];
  InternalMetadata local_3d8;
  anon_union_24_1_493b367e_for_Any_3 local_3d0;
  string local_3b8;
  undefined1 local_398 [8];
  InternalMetadata local_390;
  string local_370;
  undefined1 local_350 [32];
  int local_330 [2];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  MessageFieldComparison local_308;
  long *local_300 [2];
  long local_2f0 [2];
  undefined4 local_2e0;
  undefined1 local_1a0 [184];
  undefined1 local_e8 [184];
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_e8,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_1a0,(Arena *)0x0);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_e8 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  pMVar3 = (Map<std::__cxx11::string,int> *)
           protobuf::internal::
           TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::MutableMap((TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)((long)pvVar2 + 0x58));
  local_350._0_8_ = local_350 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"key_a","");
  local_330[0] = 1;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"key_b","");
  local_308 = 2;
  plVar6 = local_2f0;
  local_300[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"key_c","");
  local_2e0 = 3;
  lVar4 = 0;
  do {
    Map<std::__cxx11::string,int>::TryEmplaceInternal<std::__cxx11::string_const&,int_const&>
              ((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_bool>
                *)local_3e0,pMVar3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_350 + lVar4),(int *)((long)local_330 + lVar4));
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0x78);
  lVar4 = -0x78;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -5;
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_1a0 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  pMVar3 = (Map<std::__cxx11::string,int> *)
           protobuf::internal::
           TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           ::MutableMap((TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)((long)pvVar2 + 0x58));
  local_350._0_8_ = local_350 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"key_a","");
  local_330[0] = 1;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"key_b","");
  local_308 = 3;
  plVar6 = local_2f0;
  local_300[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"key_d","");
  local_2e0 = 4;
  lVar4 = 0;
  do {
    Map<std::__cxx11::string,int>::TryEmplaceInternal<std::__cxx11::string_const&,int_const&>
              ((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_bool>
                *)local_3e0,pMVar3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_350 + lVar4),(int *)((long)local_330 + lVar4));
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0x78);
  lVar4 = -0x78;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -5;
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_350);
  local_370._M_string_length = 0;
  local_370.field_2._M_local_buf[0] = '\0';
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  util::MessageDifferencer::ReportDifferencesToString((MessageDifferencer *)local_350,&local_370);
  bVar1 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)local_350,(Message *)local_e8,(Message *)local_1a0);
  local_398[0] = (internal)!bVar1;
  local_390.ptr_ = 0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3e0,(internal *)local_398,(AssertionResult *)0x122213d,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x92e,(char *)CONCAT71(local_3e0._1_7_,local_3e0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_408,(Message *)&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_408);
    if ((anon_union_24_1_493b367e_for_Any_3 *)CONCAT71(local_3e0._1_7_,local_3e0[0]) != &local_3d0)
    {
      operator_delete((anon_union_24_1_493b367e_for_Any_3 *)CONCAT71(local_3e0._1_7_,local_3e0[0]),
                      local_3d0._0_8_ + 1);
    }
    if ((long *)local_3b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_3b8._M_dataplus._M_p + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_390,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_390.ptr_);
    }
  }
  testing::internal::CmpHelperEQ<char[95],std::__cxx11::string>
            ((internal *)local_3e0,
             "\"modified: item[0].mp[key_b]: 2 -> 3\\n\" \"added: item[0].mp[key_d]: 4\\n\" \"deleted: item[0].mp[key_c]: 3\\n\""
             ,"diff",(char (*) [95])
                     "modified: item[0].mp[key_b]: 2 -> 3\nadded: item[0].mp[key_d]: 4\ndeleted: item[0].mp[key_c]: 3\n"
             ,&local_370);
  if (local_3e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_398);
    if ((UntypedMapBase *)local_3d8.ptr_ == (UntypedMapBase *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = *(char **)local_3d8.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x933,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if ((long *)CONCAT71(local_398._1_7_,local_398[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_398._1_7_,local_398[0]) + 8))();
    }
  }
  if ((UntypedMapBase *)local_3d8.ptr_ != (UntypedMapBase *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8.ptr_
                );
  }
  Any::Any((Any *)local_3e0,(Arena *)0x0);
  Any::Any((Any *)local_398,(Arena *)0x0);
  Any::PackFrom((Any *)local_3e0,(Message *)local_e8);
  Any::PackFrom((Any *)local_398,(Message *)local_1a0);
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_local_buf[0] = '\0';
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  util::MessageDifferencer::ReportDifferencesToString((MessageDifferencer *)local_350,&local_3b8);
  bVar1 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)local_350,(Message *)local_3e0,(Message *)local_398);
  local_418.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar1;
  local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_420);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_408,(internal *)&local_418,
               (AssertionResult *)"differencer.Compare(any1, any2)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x93a,(char *)CONCAT71(local_408._1_7_,local_408[0]));
    testing::internal::AssertHelper::operator=(&local_3e8,(Message *)&local_420);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_408._1_7_,local_408[0]) != &local_3f8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_408._1_7_,local_408[0]),local_3f8._M_allocated_capacity + 1)
      ;
    }
    if (local_420._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_420._M_head_impl + 8))();
    }
    if (local_410 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_410,local_410);
    }
  }
  testing::internal::CmpHelperEQ<char[95],std::__cxx11::string>
            ((internal *)local_408,
             "\"modified: item[0].mp[key_b]: 2 -> 3\\n\" \"added: item[0].mp[key_d]: 4\\n\" \"deleted: item[0].mp[key_c]: 3\\n\""
             ,"diff_with_any",
             (char (*) [95])
             "modified: item[0].mp[key_b]: 2 -> 3\nadded: item[0].mp[key_d]: 4\ndeleted: item[0].mp[key_c]: 3\n"
             ,&local_3b8);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message(&local_418);
    if (local_400 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_400->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x93f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_420);
    if ((long *)CONCAT71(local_418.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_418.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_418.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_418.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_400 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_400,local_400);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    CONCAT71(local_3b8.field_2._M_allocated_capacity._1_7_,
                             local_3b8.field_2._M_local_buf[0]) + 1);
  }
  Any::~Any((Any *)local_398);
  Any::~Any((Any *)local_3e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,
                    CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                             local_370.field_2._M_local_buf[0]) + 1);
  }
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_350);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_1a0);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_e8);
  return;
}

Assistant:

TEST(MessageDifferencerTest, PrintMapKeysTest) {
  // Note that because map is unordered, the comparison
  // output string for test evaluation cannot assume order of
  // output of fields (IOW if two fields are deleted
  // one cannot assume which deleted field log will be printed first).
  // Test currently just has a single record per operation to address this.
  // This should only be a limitation for EXPECT_EQ evaluation.
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  item->mutable_mp()->insert({{"key_a", 1}, {"key_b", 2}, {"key_c", 3}});
  item = msg2.add_item();
  item->mutable_mp()->insert({{"key_a", 1}, {"key_b", 3}, {"key_d", 4}});

  util::MessageDifferencer differencer;
  std::string diff;
  differencer.ReportDifferencesToString(&diff);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "modified: item[0].mp[key_b]: 2 -> 3\n"
      "added: item[0].mp[key_d]: 4\n"
      "deleted: item[0].mp[key_c]: 3\n",
      diff);

  google::protobuf::Any any1, any2;
  any1.PackFrom(msg1);
  any2.PackFrom(msg2);
  std::string diff_with_any;
  differencer.ReportDifferencesToString(&diff_with_any);
  EXPECT_FALSE(differencer.Compare(any1, any2));
  EXPECT_EQ(
      "modified: item[0].mp[key_b]: 2 -> 3\n"
      "added: item[0].mp[key_d]: 4\n"
      "deleted: item[0].mp[key_c]: 3\n",
      diff_with_any);
}